

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::
FindExtensionInfoFromFieldNumber<google::protobuf::internal::DescriptorPoolExtensionFinder>
          (ExtensionSet *this,int wire_type,int field_number,
          DescriptorPoolExtensionFinder *extension_finder,ExtensionInfo *extension,
          bool *was_packed_on_wire)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = DescriptorPoolExtensionFinder::Find(extension_finder,field_number,extension);
  if (bVar2) {
    if ((byte)(extension->type - 0x13) < 0xee) {
      FindExtensionInfoFromFieldNumber<google::protobuf::internal::DescriptorPoolExtensionFinder>();
LAB_0026dc5b:
      FindExtensionInfoFromFieldNumber<google::protobuf::internal::DescriptorPoolExtensionFinder>();
    }
    uVar1 = *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)extension->type * 4);
    *was_packed_on_wire = false;
    if ((wire_type == 2) && (extension->is_repeated != false)) {
      if (5 < uVar1) goto LAB_0026dc5b;
      if ((0x1cU >> (uVar1 & 0x1f) & 1) == 0) {
        *was_packed_on_wire = true;
        return true;
      }
    }
    bVar2 = uVar1 == wire_type;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FindExtensionInfoFromFieldNumber(int wire_type, int field_number,
                                        ExtensionFinder* extension_finder,
                                        ExtensionInfo* extension,
                                        bool* was_packed_on_wire) const {
    if (!extension_finder->Find(field_number, extension)) {
      return false;
    }

    ABSL_DCHECK(extension->type > 0 &&
                extension->type <= WireFormatLite::MAX_FIELD_TYPE);
    auto real_type = static_cast<WireFormatLite::FieldType>(extension->type);

    WireFormatLite::WireType expected_wire_type =
        WireFormatLite::WireTypeForFieldType(real_type);

    // Check if this is a packed field.
    *was_packed_on_wire = false;
    if (extension->is_repeated &&
        wire_type == WireFormatLite::WIRETYPE_LENGTH_DELIMITED &&
        is_packable(expected_wire_type)) {
      *was_packed_on_wire = true;
      return true;
    }
    // Otherwise the wire type must match.
    return expected_wire_type == wire_type;
  }